

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rehash.cpp
# Opt level: O2

bool Jupiter::removeOnRehash(OnRehashFunctionType in_function)

{
  _List_node_base *p_Var1;
  list<RehashFunction_*,_std::allocator<RehashFunction_*>_> *__position;
  
  __position = &o_rehash_functions_abi_cxx11_;
  do {
    __position = (list<RehashFunction_*,_std::allocator<RehashFunction_*>_> *)
                 ((_List_node_base *)__position)->_M_next;
    if (__position == &o_rehash_functions_abi_cxx11_) goto LAB_001468e0;
    p_Var1 = ((_List_node_base *)((long)__position + 0x10))->_M_next;
  } while (p_Var1->_M_prev != (_List_node_base *)in_function);
  (*(code *)p_Var1->_M_next[1]._M_prev)(p_Var1);
  std::__cxx11::list<RehashFunction_*,_std::allocator<RehashFunction_*>_>::erase
            (&o_rehash_functions_abi_cxx11_,(const_iterator)__position);
LAB_001468e0:
  return __position != &o_rehash_functions_abi_cxx11_;
}

Assistant:

bool Jupiter::removeOnRehash(OnRehashFunctionType in_function)
{
	for (auto node = o_rehash_functions.begin(); node != o_rehash_functions.end(); ++node)
	{
		if ((*node)->m_function == in_function)
		{
			delete *node;
			o_rehash_functions.erase(node);
			return true;
		}
	}

	return false;
}